

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O1

Maybe<unsigned_long> __thiscall
kj::HashIndex<kj::HashMap<kj::StringPtr,unsigned_short>::Callbacks>::
insert<kj::HashMap<kj::StringPtr,unsigned_short>::Entry,kj::StringPtr&>
          (HashIndex<kj::HashMap<kj::StringPtr,unsigned_short>::Callbacks> *this,
          ArrayPtr<kj::HashMap<kj::StringPtr,_unsigned_short>::Entry> table,size_t pos,
          StringPtr *params)

{
  uint uVar1;
  HashBucket *pHVar2;
  size_t sVar3;
  void *__s2;
  HashBucket HVar4;
  uint uVar5;
  int iVar6;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 *paVar7;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 __n;
  ulong uVar8;
  HashIndex<kj::HashMap<kj::StringPtr,_unsigned_short>::Callbacks> *this_00;
  undefined8 *in_R9;
  uint uVar9;
  size_t sVar10;
  HashBucket *_s944;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 *paVar11;
  Maybe<unsigned_long> MVar12;
  ArrayPtr<const_unsigned_char> s;
  
  this_00 = (HashIndex<kj::HashMap<kj::StringPtr,_unsigned_short>::Callbacks> *)table.ptr;
  if ((this_00->buckets).size_ * 2 < (this_00->erasedCount + pos) * 3 + 3) {
    HashIndex<kj::HashMap<kj::StringPtr,_unsigned_short>::Callbacks>::rehash(this_00,pos * 3 + 3);
  }
  s.size_ = in_R9[1] - 1;
  s.ptr = (uchar *)*in_R9;
  uVar5 = kj::_::HashCoder::operator*((HashCoder *)&kj::_::HASHCODER,s);
  pHVar2 = (this_00->buckets).ptr;
  sVar3 = (this_00->buckets).size_;
  __s2 = (void *)*in_R9;
  HVar4 = *(HashBucket *)(in_R9 + 1);
  paVar11 = (anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 *)0x0;
  uVar9 = (int)sVar3 - 1U & uVar5;
  do {
    paVar7 = (anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 *)(pHVar2 + uVar9);
    uVar1 = *(uint *)((long)paVar7 + 4);
    if (uVar1 == 1) {
      if (paVar11 == (anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 *)0x0) {
        paVar11 = paVar7;
      }
    }
    else {
      if (uVar1 == 0) {
        if (paVar11 != (anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 *)0x0) {
          this_00->erasedCount = this_00->erasedCount - 1;
          paVar7 = paVar11;
        }
        __n.value = ((ulong)uVar5 | (long)params << 0x20) + 0x200000000;
        paVar7->value = (unsigned_long)__n;
        *this = (HashIndex<kj::HashMap<kj::StringPtr,unsigned_short>::Callbacks>)0x0;
        goto LAB_0018be5f;
      }
      if (*(uint *)paVar7 == uVar5) {
        uVar8 = (ulong)(uVar1 - 2);
        __n = (anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2)
              ((anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 *)
              (table.size_ + 8 + uVar8 * 0x18))->value;
        if (((HashBucket)__n.value == HVar4) &&
           (((HashBucket)__n.value == (HashBucket)0x0 ||
            (iVar6 = bcmp(*(void **)(table.size_ + uVar8 * 0x18),__s2,__n.value), __n = extraout_RDX
            , iVar6 == 0)))) {
          *this = (HashIndex<kj::HashMap<kj::StringPtr,unsigned_short>::Callbacks>)0x1;
          *(ulong *)(this + 8) = uVar8;
LAB_0018be5f:
          MVar12.ptr.field_1.value = __n.value;
          MVar12.ptr._0_8_ = this;
          return (Maybe<unsigned_long>)MVar12.ptr;
        }
      }
    }
    sVar10 = (ulong)uVar9 + 1;
    uVar9 = (uint)sVar10;
    if (sVar10 == sVar3) {
      uVar9 = 0;
    }
  } while( true );
}

Assistant:

kj::Maybe<size_t> insert(kj::ArrayPtr<Row> table, size_t pos, Params&&... params) {
    if (buckets.size() * 2 < (table.size() + 1 + erasedCount) * 3) {
      // Load factor is more than 2/3, let's rehash so that it's 1/3, i.e. double the buckets.
      // Note that rehashing also cleans up erased entries, so we may not actually be doubling if
      // there are a lot of erasures. Nevertheless, this gives us amortized constant time -- it
      // would take at least O(table.size()) more insertions (whether or not erasures occur)
      // before another rehash is needed.
      rehash((table.size() + 1) * 3);
    }

    uint hashCode = cb.hashCode(params...);
    Maybe<_::HashBucket&> erasedSlot;
    for (uint i = _::chooseBucket(hashCode, buckets.size());; i = _::probeHash(buckets, i)) {
      auto& bucket = buckets[i];
      if (bucket.isEmpty()) {
        // no duplicates found
        KJ_IF_SOME(s, erasedSlot) {
          --erasedCount;
          s = { hashCode, uint(pos) };
        } else {
          bucket = { hashCode, uint(pos) };
        }
        return kj::none;
      } else if (bucket.isErased()) {
        // We can fill in the erased slot. However, we have to keep searching to make sure there
        // are no duplicates before we do that.
        if (erasedSlot == kj::none) {
          erasedSlot = bucket;
        }
      } else if (bucket.hash == hashCode &&
                 cb.matches(bucket.getRow(table), params...)) {
        // duplicate row
        return size_t(bucket.getPos());
      }
    }